

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PhysBCFunct.H
# Opt level: O1

void __thiscall
amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::ccfcdoit<amrex::FilfcFace>
          (GpuBndryFuncFab<PeleLMCCFillExtDir> *this,Box *bx,FArrayBox *dest,int dcomp,int numcomp,
          Geometry *geom,Real time,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,
          int bcomp,int orig_comp,FilfcFace *fillfunc)

{
  Box *pBVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  double *pdVar5;
  undefined8 uVar6;
  ulong uVar7;
  ProbParm *pPVar8;
  ACParm *pAVar9;
  double *pdVar10;
  Box *pBVar11;
  GpuBndryFuncFab<PeleLMCCFillExtDir> *pGVar12;
  GpuBndryFuncFab<PeleLMCCFillExtDir> *pGVar13;
  Real RVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  Real *pRVar26;
  Real *pRVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  uint bitval;
  uint uVar31;
  byte bVar32;
  int iVar33;
  int iVar34;
  int iVar36;
  undefined1 auVar35 [16];
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  Box lhs;
  Box bx_2;
  Box bx_1;
  Box bx_8;
  IndexType local_438;
  uint uStack_434;
  int iStack_430;
  uint auStack_42c [2];
  IndexType IStack_424;
  uint local_420;
  undefined8 local_410;
  Box local_408;
  ulong local_3e8;
  ulong local_3e0;
  int local_3d4;
  CoordType local_3d0;
  uint local_3cc;
  uint local_3c8;
  uint local_3c4;
  int local_3c0;
  int local_3bc;
  undefined8 local_3b8;
  uint local_3b0;
  pointer local_3a8;
  long local_3a0;
  undefined1 local_398 [112];
  undefined8 local_328;
  undefined8 local_320;
  int iStack_318;
  uint uStack_314;
  uint uStack_310;
  int iStack_30c;
  int iStack_308;
  int local_304;
  undefined8 local_300;
  int local_2f8;
  uint local_2f4;
  Real local_2f0;
  int local_2e8;
  Real local_2e4;
  int local_2dc;
  uint local_2d8;
  undefined8 local_2d4;
  int local_2cc;
  int local_2c8 [6];
  undefined4 local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  Real local_2a0;
  uint local_298;
  uint local_294;
  uint local_290;
  CoordType local_28c;
  Real local_288;
  int local_280;
  int aiStack_278 [2];
  int iStack_270;
  uint local_26c [3];
  IndexType IStack_260;
  long local_258;
  undefined1 local_250 [20];
  undefined1 auStack_23c [8];
  int iStack_234;
  undefined8 local_230;
  Dim3 local_228;
  undefined8 local_21c;
  int local_214;
  int iStack_210;
  int local_20c [4];
  int iStack_1fc;
  int iStack_1f8;
  uint uStack_1f4;
  int aiStack_1f0 [2];
  IndexType IStack_1e8;
  uint local_1e4;
  pointer local_1e0;
  int local_1d8;
  int aiStack_1d4 [6];
  int local_1bc;
  Real local_1b8;
  int local_1b0;
  uint local_1ac;
  int local_1a8;
  undefined8 local_1a4;
  int local_19c;
  Real local_198;
  uint local_190;
  undefined8 local_18c;
  int local_184;
  Real local_180;
  int local_178;
  uint local_174;
  IndexType local_170;
  undefined4 uStack_16c;
  int local_168;
  undefined8 uStack_164;
  int iStack_15c;
  uint local_158;
  uint uStack_154;
  uint local_150;
  uint local_14c;
  uint local_148 [2];
  undefined8 local_140;
  uint local_138;
  int local_134;
  int local_130;
  uint local_12c [4];
  undefined8 local_11c;
  int local_114;
  undefined8 local_110;
  int local_108;
  uint local_104;
  double *local_100;
  Box *local_f8;
  GpuBndryFuncFab<PeleLMCCFillExtDir> *local_f0;
  long local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  long local_c8;
  long local_c0;
  Real local_b8;
  uint local_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  ulong local_90;
  Real local_88;
  Real RStack_80;
  Real local_78;
  Real RStack_70;
  Real local_68;
  Real RStack_60;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  bVar32 = 0;
  local_f0 = this;
  iVar30 = (bx->bigend).vect[0];
  uVar4 = *(undefined8 *)(bx->smallend).vect;
  iVar29 = (int)uVar4;
  iVar33 = (int)((ulong)uVar4 >> 0x20);
  uVar31 = (iVar30 - iVar29) + 1;
  uVar4 = *(undefined8 *)((bx->bigend).vect + 1);
  iVar34 = (int)uVar4;
  iVar36 = (int)((ulong)uVar4 >> 0x20);
  iVar23 = (iVar34 - iVar33) + 1;
  iVar22 = (bx->smallend).vect[2];
  local_3b0 = (iVar36 - iVar22) + 1;
  local_3b8 = CONCAT44(iVar23,uVar31);
  uVar2 = (bx->btype).itype;
  uVar4 = *(undefined8 *)(geom->domain).smallend.vect;
  uVar6 = *(undefined8 *)((geom->domain).smallend.vect + 2);
  local_26c[1] = (uint)((ulong)*(undefined8 *)(geom->domain).bigend.vect >> 0x20);
  stack0xfffffffffffffd9c = *(undefined8 *)((geom->domain).bigend.vect + 2);
  aiStack_278[0] = (int)uVar4;
  aiStack_278[1] = SUB84(uVar4,4);
  iStack_270 = (int)uVar6;
  local_26c[0] = (uint)((ulong)uVar6 >> 0x20);
  lVar20 = 0;
  do {
    uVar24 = 1 << ((byte)lVar20 & 0x1f);
    uVar28 = (uint)lVar20;
    local_26c[lVar20] =
         (local_26c[lVar20] + (uint)((uVar2 >> (uVar28 & 0x1f) & 1) != 0)) -
         (uint)((IStack_260.itype >> (uVar28 & 0x1f) & 1) != 0);
    if ((uVar2 >> (uVar28 & 0x1f) & 1) == 0) {
      local_420 = ~uVar24 & IStack_260.itype;
    }
    else {
      local_420 = uVar24 | IStack_260.itype;
    }
    IStack_260.itype = local_420;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  auStack_42c[1] = local_26c[1];
  IStack_424.itype = local_26c[2];
  local_438.itype = (uint)uVar4;
  uStack_434 = SUB84(uVar4,4);
  iStack_430 = iStack_270;
  auStack_42c[0] = local_26c[0];
  lVar20 = 0;
  do {
    if (*(char *)((long)(geom->super_CoordSys).inv_dx + lVar20 + 0x19) == '\x01') {
      iVar3 = *(int *)((long)&local_3b8 + lVar20 * 4);
      (&local_438)[lVar20].itype = (&local_438)[lVar20].itype - iVar3;
      auStack_42c[lVar20] = auStack_42c[lVar20] + iVar3;
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  auVar35._0_4_ = -(uint)((int)auStack_42c[1] < iVar34);
  auVar35._4_4_ = -(uint)((int)IStack_424.itype < iVar36);
  auVar35._8_4_ = -(uint)(iVar29 < (int)local_438.itype);
  auVar35._12_4_ = -(uint)(iVar33 < (int)uStack_434);
  iVar29 = movmskps(iVar30,auVar35);
  if (((iVar29 != 0) || ((int)auStack_42c[0] < iVar30)) || (iVar22 < iStack_430)) {
    local_f8 = bx;
    pdVar5 = (dest->super_BaseFab<double>).dptr;
    local_100 = pdVar5;
    iVar30 = (dest->super_BaseFab<double>).nvar;
    pBVar1 = &(dest->super_BaseFab<double>).domain;
    iVar22 = (dest->super_BaseFab<double>).domain.smallend.vect[1];
    local_d8._0_8_ = *(undefined8 *)(pBVar1->smallend).vect;
    local_e8 = (long)(dest->super_BaseFab<double>).domain.smallend.vect[2];
    lVar20 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[0];
    local_68 = (geom->prob_domain).xhi[1];
    RStack_60 = (geom->prob_domain).xhi[2];
    local_78 = (geom->prob_domain).xlo[2];
    RStack_70 = (geom->prob_domain).xhi[0];
    local_88 = (geom->prob_domain).xlo[0];
    RStack_80 = (geom->prob_domain).xlo[1];
    uVar4 = *(undefined8 *)(geom->domain).bigend.vect;
    local_58 = *(undefined8 *)(geom->domain).smallend.vect;
    uStack_50 = (undefined4)*(undefined8 *)((geom->domain).smallend.vect + 2);
    uStack_4c = (undefined4)uVar4;
    uStack_48 = (undefined4)((ulong)uVar4 >> 0x20);
    uStack_44 = *(undefined8 *)((geom->domain).bigend.vect + 2);
    local_a8 = *(undefined4 *)(geom->super_CoordSys).dx;
    uStack_a4 = *(undefined4 *)((long)(geom->super_CoordSys).dx + 4);
    uStack_a0 = *(undefined4 *)((geom->super_CoordSys).dx + 1);
    uStack_9c = *(undefined4 *)((long)(geom->super_CoordSys).dx + 0xc);
    local_d8._8_8_ = (geom->super_CoordSys).dx[2];
    local_3c4 = (uint)(byte)(geom->super_CoordSys).field_0x51;
    local_3c8 = (uint)(byte)(geom->super_CoordSys).field_0x52;
    local_3cc = (uint)(byte)(geom->super_CoordSys).field_0x53;
    local_3d0 = (geom->super_CoordSys).c_sys;
    local_3a8 = (bcr->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_410 = (ulong)uVar31;
    local_398._0_4_ = local_438.itype - uVar31;
    local_398._4_4_ = uStack_434;
    local_398._8_4_ = iStack_430;
    local_398._12_4_ = local_438.itype - 1;
    lVar25 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    local_258 = (lVar20 - (pBVar1->smallend).vect[0]) + 1;
    local_c8 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    local_3e0 = lVar20 + 1U & 0xffffffff;
    local_3e8 = CONCAT44(IStack_424.itype,auStack_42c[1]);
    local_398._16_4_ = auStack_42c[1];
    local_398._20_4_ = IStack_424.itype;
    local_398._24_4_ = local_420 & 0xfffffffe;
    lVar20 = 0;
    do {
      uVar24 = 1 << ((byte)lVar20 & 0x1f);
      uVar28 = (uint)lVar20;
      *(uint *)(local_398 + lVar20 * 4 + 0xc) =
           (*(int *)(local_398 + lVar20 * 4 + 0xc) + (uint)((uVar2 >> (uVar28 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_398._24_4_ >> (uVar28 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar28 & 0x1f) & 1) == 0) {
        local_398._24_4_ = ~uVar24 & local_398._24_4_;
      }
      else {
        local_398._24_4_ = uVar24 | local_398._24_4_;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    local_c0 = (lVar25 - iVar22) * local_258;
    local_398._28_4_ = local_438.itype;
    local_398._32_4_ = uStack_434 - iVar23;
    local_398._36_4_ = iStack_430;
    local_398._40_4_ = auStack_42c[0];
    local_398._44_4_ = uStack_434 - 1;
    local_398._48_4_ = IStack_424.itype;
    local_398._52_4_ = local_420 & 0xfffffffd;
    lVar20 = 0;
    do {
      uVar24 = 1 << ((byte)lVar20 & 0x1f);
      uVar28 = (uint)lVar20;
      *(uint *)(local_398 + lVar20 * 4 + 0x28) =
           (*(int *)(local_398 + lVar20 * 4 + 0x28) + (uint)((uVar2 >> (uVar28 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_398._52_4_ >> (uVar28 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar28 & 0x1f) & 1) == 0) {
        local_398._52_4_ = ~uVar24 & local_398._52_4_;
      }
      else {
        local_398._52_4_ = uVar24 | local_398._52_4_;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    local_e0 = (local_c8 - local_e8) * local_c0;
    local_398._72_4_ = auStack_42c[1];
    local_398._68_4_ = auStack_42c[0];
    local_398._56_4_ = local_438.itype;
    local_398._60_4_ = uStack_434;
    local_398._64_4_ = iStack_430 - local_3b0;
    local_398._76_4_ = iStack_430 + -1;
    local_398._80_4_ = local_420 & 0xfffffffb;
    lVar20 = 0;
    do {
      uVar24 = 1 << ((byte)lVar20 & 0x1f);
      uVar28 = (uint)lVar20;
      *(uint *)(local_398 + lVar20 * 4 + 0x44) =
           (*(int *)(local_398 + lVar20 * 4 + 0x44) + (uint)((uVar2 >> (uVar28 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_398._80_4_ >> (uVar28 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar28 & 0x1f) & 1) == 0) {
        local_398._80_4_ = ~uVar24 & local_398._80_4_;
      }
      else {
        local_398._80_4_ = uVar24 | local_398._80_4_;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    local_3a0 = (lVar25 << 0x20) + local_3e0;
    local_398._84_4_ = (~local_420 & 1) + auStack_42c[0];
    local_398._88_4_ = uStack_434;
    local_398._92_4_ = iStack_430;
    local_398._96_4_ = uVar31 + local_398._84_4_ + -1;
    local_398._100_4_ = auStack_42c[1];
    local_398._104_4_ = IStack_424.itype;
    local_398._108_4_ = local_420 & 0xfffffffe;
    lVar20 = 0;
    do {
      uVar28 = 1 << ((byte)lVar20 & 0x1f);
      uVar31 = (uint)lVar20;
      *(uint *)(local_398 + lVar20 * 4 + 0x60) =
           (*(int *)(local_398 + lVar20 * 4 + 0x60) + (uint)((uVar2 >> (uVar31 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_398._108_4_ >> (uVar31 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar31 & 0x1f) & 1) == 0) {
        local_398._108_4_ = ~uVar28 & local_398._108_4_;
      }
      else {
        local_398._108_4_ = uVar28 | local_398._108_4_;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    iVar22 = auStack_42c[1] + ((local_420 & 2) == 0);
    local_328 = (BCRec *)CONCAT44(iVar22,local_438.itype);
    local_320 = (ProbParm *)CONCAT44(auStack_42c[0],iStack_430);
    iStack_318 = iVar23 + iVar22 + -1;
    uStack_314 = IStack_424.itype;
    uStack_310 = local_420 & 0xfffffffd;
    lVar20 = 0;
    do {
      uVar28 = 1 << ((byte)lVar20 & 0x1f);
      uVar31 = (uint)lVar20;
      *(uint *)(local_398 + lVar20 * 4 + 0x7c) =
           (*(int *)(local_398 + lVar20 * 4 + 0x7c) + (uint)((uVar2 >> (uVar31 & 0x1f) & 1) != 0)) -
           (uint)((uStack_310 >> (uVar31 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar31 & 0x1f) & 1) == 0) {
        uStack_310 = ~uVar28 & uStack_310;
      }
      else {
        uStack_310 = uVar28 | uStack_310;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    iStack_308 = uStack_434;
    iStack_30c = local_438.itype;
    local_304 = IStack_424.itype + ((local_420 & 4) == 0);
    local_300 = (Real)CONCAT44(auStack_42c[1],auStack_42c[0]);
    local_2f8 = local_3b0 + local_304 + -1;
    local_2f4 = local_420 & 0xfffffffb;
    lVar20 = 0;
    do {
      uVar31 = 1 << ((byte)lVar20 & 0x1f);
      uVar28 = (uint)lVar20;
      *(uint *)(local_398 + lVar20 * 4 + 0x98) =
           (*(int *)(local_398 + lVar20 * 4 + 0x98) + (uint)((uVar2 >> (uVar28 & 0x1f) & 1) != 0)) -
           (uint)((local_2f4 >> (uVar28 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar28 & 0x1f) & 1) == 0) {
        local_2f4 = ~uVar31 & local_2f4;
      }
      else {
        local_2f4 = uVar31 | local_2f4;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    local_3a8 = local_3a8 + bcomp;
    lVar20 = 0;
    local_b8 = time;
    local_3d4 = iVar30;
    local_3c0 = numcomp;
    local_3bc = dcomp;
    do {
      uVar18 = uStack_9c;
      uVar17 = uStack_a0;
      uVar16 = uStack_a4;
      uVar15 = local_a8;
      RVar14 = local_b8;
      uVar4 = local_d8._8_8_;
      uVar39 = *(ulong *)(local_398 + lVar20);
      uVar7 = *(ulong *)(local_398 + lVar20 + 0xc);
      local_408.smallend.vect[2] = (int)*(undefined8 *)(local_398 + lVar20 + 8);
      uVar38 = *(ulong *)(bx->smallend).vect;
      uVar37 = CONCAT44(-(uint)((int)(uVar38 >> 0x20) < (int)(uVar39 >> 0x20)),
                        -(uint)((int)uVar38 < (int)uVar39));
      uVar38 = ~uVar37 & uVar38 | uVar39 & uVar37;
      local_408.smallend.vect[0] = (int)uVar38;
      local_408.smallend.vect[1] = (int)(uVar38 >> 0x20);
      iVar22 = (bx->smallend).vect[2];
      if (iVar22 < local_408.smallend.vect[2]) {
        iVar22 = local_408.smallend.vect[2];
      }
      uVar38 = *(ulong *)(bx->bigend).vect;
      uVar39 = CONCAT44(-(uint)((int)(uVar7 >> 0x20) < (int)(uVar38 >> 0x20)),
                        -(uint)((int)uVar7 < (int)uVar38));
      uVar38 = ~uVar39 & uVar38 | uVar7 & uVar39;
      local_408.bigend.vect[0] = (int)uVar38;
      local_408.bigend.vect[1] = (int)(uVar38 >> 0x20);
      local_408.bigend.vect[2] = (int)*(undefined8 *)(local_398 + lVar20 + 0x14);
      iVar29 = (bx->bigend).vect[2];
      if (local_408.bigend.vect[2] < iVar29) {
        iVar29 = local_408.bigend.vect[2];
      }
      local_408.btype.itype = (uint)((ulong)*(undefined8 *)(local_398 + lVar20 + 0x14) >> 0x20);
      local_408.bigend.vect[2] = iVar29;
      local_250._8_4_ = SUB84(pdVar5,0);
      local_250._12_4_ = (undefined4)((ulong)pdVar5 >> 0x20);
      stack0xfffffffffffffdc0 = local_258;
      stack0xfffffffffffffdc8 = local_c0;
      local_230 = local_e0;
      local_228.x = local_d8._0_4_;
      local_228.y = local_d8._4_4_;
      local_228.z = (int)local_e8;
      local_21c = local_3a0;
      local_214 = (int)local_c8;
      iStack_210 = iVar30;
      local_20c[2] = local_3c0;
      local_20c[1] = local_3bc;
      aiStack_1f0[0] = local_26c[1];
      aiStack_1f0[1] = local_26c[2];
      IStack_1e8.itype = IStack_260.itype;
      local_20c[3] = aiStack_278[0];
      iStack_1fc = aiStack_278[1];
      iStack_1f8 = iStack_270;
      uStack_1f4 = local_26c[0];
      local_1e0 = local_3a8;
      pPVar8 = (this->m_user_f).lprobparm;
      pAVar9 = (this->m_user_f).lacparm;
      aiStack_1d4[3] = (int)((ulong)*(undefined8 *)((long)&(this->m_user_f).lacparm + 4) >> 0x20);
      aiStack_1d4._16_8_ = *(undefined8 *)((long)&(this->m_user_f).lpmfdata + 4);
      local_1d8 = (int)pPVar8;
      aiStack_1d4[0] = (int)((ulong)pPVar8 >> 0x20);
      aiStack_1d4[1] = (int)pAVar9;
      aiStack_1d4[2] = (int)((ulong)pAVar9 >> 0x20);
      pRVar26 = &local_88;
      pRVar27 = &local_1b8;
      for (lVar25 = 10; lVar25 != 0; lVar25 = lVar25 + -1) {
        *pRVar27 = *pRVar26;
        pRVar26 = pRVar26 + (ulong)bVar32 * -2 + 1;
        pRVar27 = pRVar27 + (ulong)bVar32 * -2 + 1;
      }
      uStack_164._4_4_ = uVar17;
      uStack_164._0_4_ = uVar16;
      local_158 = (uint)uVar4;
      uStack_154 = SUB84(uVar4,4);
      local_150 = local_3c4;
      local_14c = local_3c8;
      local_148[1] = local_3d0;
      local_148[0] = local_3cc;
      local_138 = orig_comp;
      local_408.smallend.vect[2] = iVar22;
      local_168 = uVar15;
      iStack_15c = uVar18;
      local_140 = RVar14;
      For<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::ccfcdoit<amrex::FilfcFace>(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::FilfcFace&&)::_lambda(int,int,int)_1_>
                (&local_408,(anon_class_288_10_b99250ba *)local_250);
      pGVar12 = local_f0;
      pBVar1 = local_f8;
      pdVar10 = local_100;
      lVar20 = lVar20 + 0x1c;
    } while (lVar20 != 0xa8);
    local_250._0_4_ = local_438.itype - (uint)local_410;
    local_250._4_4_ = uStack_434 - iVar23;
    local_250._8_4_ = iStack_430;
    local_250._12_4_ = local_438.itype - 1;
    stack0xfffffffffffffdc0 = CONCAT44(IStack_424.itype,uStack_434 - 1);
    auStack_23c._4_4_ = local_420 & 0xfffffffc;
    lVar20 = 0;
    do {
      uVar28 = 1 << ((byte)lVar20 & 0x1f);
      uVar31 = (uint)lVar20;
      *(uint *)(auStack_23c + lVar20 * 4 + -8) =
           (*(int *)(auStack_23c + lVar20 * 4 + -8) + (uint)((uVar2 >> (uVar31 & 0x1f) & 1) != 0)) -
           (uint)(((uint)auStack_23c._4_4_ >> (uVar31 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar31 & 0x1f) & 1) == 0) {
        auStack_23c._4_4_ = ~uVar28 & auStack_23c._4_4_;
      }
      else {
        auStack_23c._4_4_ = uVar28 | auStack_23c._4_4_;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    uVar31 = local_420 & 1 ^ 1;
    iVar30 = auStack_42c[0] + uVar31;
    aiStack_1f0[0] = (int)local_3b8 + iVar30 + -1;
    stack0xfffffffffffffdc8 = CONCAT44(iVar30,auStack_23c._4_4_);
    local_230 = CONCAT44(iStack_430,uStack_434 - iVar23);
    local_228.y = uStack_434 - 1;
    local_228.x = aiStack_1f0[0];
    local_228.z = IStack_424.itype;
    local_21c._0_4_ = local_420 & 0xfffffffc;
    lVar20 = 0;
    do {
      uVar24 = 1 << ((byte)lVar20 & 0x1f);
      uVar28 = (uint)lVar20;
      (&local_228.x)[lVar20] =
           ((&local_228.x)[lVar20] + (uint)((uVar2 >> (uVar28 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_21c >> (uVar28 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar28 & 0x1f) & 1) == 0) {
        local_21c._0_4_ = ~uVar24 & (uint)local_21c;
      }
      else {
        local_21c._0_4_ = uVar24 | (uint)local_21c;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    local_90 = local_3b8 & 0xffffffff;
    local_3e0 = (ulong)local_3b8._4_4_;
    iVar22 = (int)(local_420 << 0x1e) >> 0x1f;
    local_ac = local_420 >> 2;
    local_98 = CONCAT44(iStack_430,uStack_434);
    local_21c._4_4_ = local_438.itype - (int)local_3b8;
    local_214 = auStack_42c[1] + iVar22 + 1;
    iStack_210 = iStack_430;
    local_20c[0] = local_438.itype - 1;
    local_20c[1] = auStack_42c[1] + iVar22 + local_3b8._4_4_;
    local_20c[2] = IStack_424.itype;
    local_20c[3] = local_420 & 0xfffffffc;
    lVar20 = 0;
    do {
      uVar24 = 1 << ((byte)lVar20 & 0x1f);
      uVar28 = (uint)lVar20;
      local_20c[lVar20] =
           (local_20c[lVar20] + (uint)((uVar2 >> (uVar28 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_20c[3] >> (uVar28 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar28 & 0x1f) & 1) == 0) {
        local_20c[3] = ~uVar24 & local_20c[3];
      }
      else {
        local_20c[3] = uVar24 | local_20c[3];
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    iStack_1fc = iVar30;
    iStack_1f8 = auStack_42c[1] + iVar22 + 1;
    uStack_1f4 = iStack_430;
    IStack_1e8.itype = IStack_424.itype;
    aiStack_1f0[1] = auStack_42c[1] + iVar22 + local_3b8._4_4_;
    local_1e4 = local_420 & 0xfffffffc;
    lVar20 = 0;
    do {
      uVar28 = 1 << ((byte)lVar20 & 0x1f);
      uVar24 = (uint)lVar20;
      aiStack_1f0[lVar20] =
           (aiStack_1f0[lVar20] + (uint)((uVar2 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)((local_1e4 >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar24 & 0x1f) & 1) == 0) {
        local_1e4 = ~uVar28 & local_1e4;
      }
      else {
        local_1e4 = uVar28 | local_1e4;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    local_3e8 = CONCAT44(auStack_42c[1],auStack_42c[0]);
    local_1d8 = iStack_430 - local_3b0;
    local_140._0_4_ = iStack_430 + -1;
    local_174 = local_420 & 0xfffffffa;
    local_1e0 = (BCRec *)CONCAT44(uStack_434,local_438.itype - (int)local_3b8);
    aiStack_1d4[0] = local_438.itype - 1;
    aiStack_1d4[1] = auStack_42c[1];
    aiStack_1d4[2] = (int)local_140;
    aiStack_1d4[3] = local_174;
    lVar20 = 0;
    do {
      uVar24 = 1 << ((byte)lVar20 & 0x1f);
      uVar28 = (uint)lVar20;
      aiStack_1d4[lVar20] =
           (aiStack_1d4[lVar20] + (uint)((uVar2 >> (uVar28 & 0x1f) & 1) != 0)) -
           (uint)(((uint)aiStack_1d4[3] >> (uVar28 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar28 & 0x1f) & 1) == 0) {
        aiStack_1d4[3] = ~uVar24 & aiStack_1d4[3];
      }
      else {
        aiStack_1d4[3] = uVar24 | aiStack_1d4[3];
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    uVar28 = local_420 >> 2 & 1;
    local_18c._0_4_ = uVar31 + auStack_42c[0];
    aiStack_1d4[5] = uStack_434;
    aiStack_1d4[4] = (int)local_18c;
    local_180 = (Real)CONCAT44(auStack_42c[1],(int)local_3b8 + (int)local_18c + -1);
    local_1bc = local_1d8;
    local_1b8 = local_180;
    local_1b0 = (int)local_140;
    local_1ac = local_174;
    lVar20 = 0;
    do {
      uVar24 = 1 << ((byte)lVar20 & 0x1f);
      uVar31 = (uint)lVar20;
      *(uint *)((long)&local_1b8 + lVar20 * 4) =
           (*(int *)((long)&local_1b8 + lVar20 * 4) + (uint)((uVar2 >> (uVar31 & 0x1f) & 1) != 0)) -
           (uint)((local_1ac >> (uVar31 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar31 & 0x1f) & 1) == 0) {
        local_1ac = ~uVar24 & local_1ac;
      }
      else {
        local_1ac = uVar24 | local_1ac;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    iVar30 = (uVar28 ^ 1) + IStack_424.itype;
    local_1a4._4_4_ = iVar30;
    local_1a4._0_4_ = uStack_434;
    local_1a8 = local_438.itype - (int)local_3b8;
    local_19c = local_438.itype - 1;
    local_198 = (Real)CONCAT44(local_3b0 + iVar30 + -1,auStack_42c[1]);
    local_190 = local_174;
    lVar20 = 0;
    do {
      uVar24 = 1 << ((byte)lVar20 & 0x1f);
      uVar31 = (uint)lVar20;
      (&local_19c)[lVar20] =
           ((&local_19c)[lVar20] + (uint)((uVar2 >> (uVar31 & 0x1f) & 1) != 0)) -
           (uint)((local_190 >> (uVar31 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar31 & 0x1f) & 1) == 0) {
        local_190 = ~uVar24 & local_190;
      }
      else {
        local_190 = uVar24 | local_190;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    local_18c._4_4_ = uStack_434;
    local_184 = (IStack_424.itype + 1) - uVar28;
    local_178 = local_3b0 + local_184 + -1;
    lVar20 = 0;
    do {
      uVar31 = 1 << ((byte)lVar20 & 0x1f);
      uVar28 = (uint)lVar20;
      *(uint *)((long)&local_180 + lVar20 * 4) =
           (*(int *)((long)&local_180 + lVar20 * 4) + (uint)((uVar2 >> (uVar28 & 0x1f) & 1) != 0)) -
           (uint)((local_174 >> (uVar28 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar28 & 0x1f) & 1) == 0) {
        local_174 = ~uVar31 & local_174;
      }
      else {
        local_174 = uVar31 | local_174;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    local_170.itype = local_438.itype;
    uStack_16c = uStack_434 - local_3b8._4_4_;
    local_168 = local_1d8;
    uStack_164 = ((ulong)uStack_434 << 0x20) - 0x100000000 | (ulong)auStack_42c[0];
    iStack_15c = (int)local_140;
    local_158 = local_420 & 0xfffffff9;
    lVar20 = 0;
    do {
      uVar28 = 1 << ((byte)lVar20 & 0x1f);
      uVar31 = (uint)lVar20;
      *(uint *)((long)&uStack_164 + lVar20 * 4) =
           (*(int *)((long)&uStack_164 + lVar20 * 4) + (uint)((uVar2 >> (uVar31 & 0x1f) & 1) != 0))
           - (uint)((local_158 >> (uVar31 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar31 & 0x1f) & 1) == 0) {
        local_158 = ~uVar28 & local_158;
      }
      else {
        local_158 = uVar28 | local_158;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    local_150 = auStack_42c[1] + ((local_420 & 2) == 0);
    uStack_154 = local_438.itype;
    local_14c = local_1d8;
    local_148[0] = auStack_42c[0];
    local_148[1] = local_150 + local_3b8._4_4_ + -1;
    local_140._4_4_ = local_420 & 0xfffffff9;
    lVar20 = 0;
    do {
      uVar28 = 1 << ((byte)lVar20 & 0x1f);
      uVar31 = (uint)lVar20;
      local_148[lVar20] =
           (local_148[lVar20] + (uint)((uVar2 >> (uVar31 & 0x1f) & 1) != 0)) -
           (uint)((local_140._4_4_ >> (uVar31 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar31 & 0x1f) & 1) == 0) {
        local_140._4_4_ = ~uVar28 & local_140._4_4_;
      }
      else {
        local_140._4_4_ = uVar28 | local_140._4_4_;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    iVar30 = (int)(local_420 << 0x1d) >> 0x1f;
    local_138 = local_438.itype;
    local_134 = uStack_434 - local_3b8._4_4_;
    local_130 = IStack_424.itype + 1 + iVar30;
    local_12c[0] = auStack_42c[0];
    local_12c[1] = uStack_434 - 1;
    local_12c[2] = iVar30 + IStack_424.itype + local_3b0;
    local_12c[3] = local_420 & 0xfffffff9;
    lVar20 = 0;
    do {
      uVar31 = 1 << ((byte)lVar20 & 0x1f);
      uVar28 = (uint)lVar20;
      local_12c[lVar20] =
           (local_12c[lVar20] + (uint)((uVar2 >> (uVar28 & 0x1f) & 1) != 0)) -
           (uint)((local_12c[3] >> (uVar28 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar28 & 0x1f) & 1) == 0) {
        local_12c[3] = ~uVar31 & local_12c[3];
      }
      else {
        local_12c[3] = uVar31 | local_12c[3];
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    iVar22 = (int)(local_420 << 0x1e) >> 0x1f;
    iVar30 = (int)(local_420 << 0x1d) >> 0x1f;
    local_11c = CONCAT44(auStack_42c[1] + iVar22 + 1,local_438.itype);
    local_114 = IStack_424.itype + iVar30 + 1;
    local_110 = CONCAT44(auStack_42c[1] + iVar22 + local_3b8._4_4_,auStack_42c[0]);
    local_108 = local_3b0 + IStack_424.itype + iVar30;
    local_104 = local_420 & 0xfffffff9;
    lVar20 = 0;
    do {
      uVar31 = 1 << ((byte)lVar20 & 0x1f);
      uVar28 = (uint)lVar20;
      *(uint *)((long)&local_110 + lVar20 * 4) =
           (*(int *)((long)&local_110 + lVar20 * 4) + (uint)((uVar2 >> (uVar28 & 0x1f) & 1) != 0)) -
           (uint)((local_104 >> (uVar28 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar28 & 0x1f) & 1) == 0) {
        local_104 = ~uVar31 & local_104;
      }
      else {
        local_104 = uVar31 | local_104;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    lVar20 = 0;
    local_410 = (ulong)IStack_424.itype;
    do {
      uVar18 = uStack_9c;
      uVar17 = uStack_a0;
      uVar16 = uStack_a4;
      uVar15 = local_a8;
      RVar14 = local_b8;
      uVar4 = local_d8._8_8_;
      uVar39 = *(ulong *)(local_250 + lVar20);
      uVar7 = *(ulong *)(local_250 + lVar20 + 0xc);
      local_408.smallend.vect[2] = (int)*(undefined8 *)(local_250 + lVar20 + 8);
      uVar38 = *(ulong *)(pBVar1->smallend).vect;
      uVar37 = CONCAT44(-(uint)((int)(uVar38 >> 0x20) < (int)(uVar39 >> 0x20)),
                        -(uint)((int)uVar38 < (int)uVar39));
      uVar38 = ~uVar37 & uVar38 | uVar39 & uVar37;
      local_408.smallend.vect[0] = (int)uVar38;
      local_408.smallend.vect[1] = (int)(uVar38 >> 0x20);
      iVar30 = (pBVar1->smallend).vect[2];
      if (iVar30 < local_408.smallend.vect[2]) {
        iVar30 = local_408.smallend.vect[2];
      }
      uVar38 = *(ulong *)(pBVar1->bigend).vect;
      uVar39 = CONCAT44(-(uint)((int)(uVar7 >> 0x20) < (int)(uVar38 >> 0x20)),
                        -(uint)((int)uVar7 < (int)uVar38));
      uVar38 = ~uVar39 & uVar38 | uVar7 & uVar39;
      local_408.bigend.vect[0] = (int)uVar38;
      local_408.bigend.vect[1] = (int)(uVar38 >> 0x20);
      local_408.bigend.vect[2] = (int)*(undefined8 *)(auStack_23c + lVar20);
      iVar22 = (pBVar1->bigend).vect[2];
      if (local_408.bigend.vect[2] < iVar22) {
        iVar22 = local_408.bigend.vect[2];
      }
      local_408.btype.itype = (uint)((ulong)*(undefined8 *)(auStack_23c + lVar20) >> 0x20);
      local_408.bigend.vect[2] = iVar22;
      local_398._8_4_ = SUB84(pdVar10,0);
      local_398._12_4_ = (undefined4)((ulong)pdVar10 >> 0x20);
      local_398._16_4_ = (undefined4)local_258;
      local_398._20_4_ = (undefined4)((ulong)local_258 >> 0x20);
      local_398._24_4_ = (undefined4)local_c0;
      local_398._28_4_ = (undefined4)((ulong)local_c0 >> 0x20);
      local_398._32_4_ = (undefined4)local_e0;
      local_398._36_4_ = (undefined4)((ulong)local_e0 >> 0x20);
      local_398._40_4_ = (undefined4)local_d8._0_8_;
      local_398._44_4_ = SUB84(local_d8._0_8_,4);
      local_398._48_4_ = (int)local_e8;
      local_398._52_4_ = (undefined4)local_3a0;
      local_398._56_4_ = (undefined4)((ulong)local_3a0 >> 0x20);
      local_398._60_4_ = (int)local_c8;
      local_398._64_4_ = local_3d4;
      local_398._72_4_ = local_3bc;
      local_398._76_4_ = local_3c0;
      local_398._96_4_ = local_26c[1];
      local_398._100_4_ = (undefined4)stack0xfffffffffffffd9c;
      local_398._104_4_ = SUB84(stack0xfffffffffffffd9c,4);
      local_398._80_4_ = aiStack_278[0];
      local_398._84_4_ = aiStack_278[1];
      local_398._88_4_ = iStack_270;
      local_398._92_4_ = local_26c[0];
      local_328 = local_3a8;
      pAVar9 = (pGVar12->m_user_f).lacparm;
      uStack_310 = (uint)((ulong)*(undefined8 *)((long)&(pGVar12->m_user_f).lacparm + 4) >> 0x20);
      _iStack_30c = *(undefined8 *)((long)&(pGVar12->m_user_f).lpmfdata + 4);
      local_320 = (pGVar12->m_user_f).lprobparm;
      iStack_318 = (int)pAVar9;
      uStack_314 = (uint)((ulong)pAVar9 >> 0x20);
      pRVar26 = &local_88;
      pRVar27 = (Real *)(local_398 + 0x98);
      for (lVar25 = 10; lVar25 != 0; lVar25 = lVar25 + -1) {
        *pRVar27 = *pRVar26;
        pRVar26 = pRVar26 + (ulong)bVar32 * -2 + 1;
        pRVar27 = pRVar27 + (ulong)bVar32 * -2 + 1;
      }
      local_298 = local_3c4;
      local_294 = local_3c8;
      local_290 = local_3cc;
      local_28c = local_3d0;
      local_280 = orig_comp;
      local_408.smallend.vect[2] = iVar30;
      local_2b0 = uVar15;
      uStack_2ac = uVar16;
      uStack_2a8 = uVar17;
      uStack_2a4 = uVar18;
      local_2a0 = (Real)uVar4;
      local_288 = RVar14;
      For<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::ccfcdoit<amrex::FilfcFace>(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::FilfcFace&&)::_lambda(int,int,int)_2_>
                (&local_408,(anon_class_288_10_b99250ba *)local_398);
      lVar25 = local_e8;
      pGVar13 = local_f0;
      pBVar11 = local_f8;
      pdVar5 = local_100;
      lVar20 = lVar20 + 0x1c;
    } while (lVar20 != 0x150);
    local_3e0 = local_3b8 & 0xffffffff;
    local_3e8 = (ulong)local_3b0;
    local_398._8_4_ = iStack_430 - local_3b0;
    local_398._104_4_ = iStack_430 - 1;
    local_398._0_4_ = local_438.itype - (int)local_3b8;
    local_398._4_4_ = uStack_434 - local_3b8._4_4_;
    local_398._12_4_ = local_438.itype - 1;
    local_398._16_4_ = (undefined4)(((ulong)uStack_434 << 0x20) + -0x100000000 >> 0x20);
    local_398._44_4_ = local_398._16_4_;
    local_398._20_4_ = local_398._104_4_;
    local_410 = CONCAT44(local_410._4_4_,local_420) & 0xfffffffffffffff8;
    local_398._24_4_ = local_420 & 0xfffffff8;
    lVar20 = 0;
    do {
      uVar28 = 1 << ((byte)lVar20 & 0x1f);
      uVar31 = (uint)lVar20;
      *(uint *)(local_398 + lVar20 * 4 + 0xc) =
           (*(int *)(local_398 + lVar20 * 4 + 0xc) + (uint)((uVar2 >> (uVar31 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_398._24_4_ >> (uVar31 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar31 & 0x1f) & 1) == 0) {
        local_398._24_4_ = ~uVar28 & local_398._24_4_;
      }
      else {
        local_398._24_4_ = uVar28 | local_398._24_4_;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    local_398._28_4_ = auStack_42c[0] - (local_420 & 1);
    local_398._96_4_ = (int)local_3b8 + local_398._28_4_;
    local_398._28_4_ = local_398._28_4_ + 1;
    local_398._32_4_ = uStack_434 - local_3b8._4_4_;
    local_398._36_4_ = local_398._8_4_;
    local_398._40_4_ = local_398._96_4_;
    local_398._48_4_ = local_398._104_4_;
    local_398._52_4_ = (uint)local_410;
    lVar20 = 0;
    do {
      uVar28 = 1 << ((byte)lVar20 & 0x1f);
      uVar31 = (uint)lVar20;
      *(uint *)(local_398 + lVar20 * 4 + 0x28) =
           (*(int *)(local_398 + lVar20 * 4 + 0x28) + (uint)((uVar2 >> (uVar31 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_398._52_4_ >> (uVar31 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar31 & 0x1f) & 1) == 0) {
        local_398._52_4_ = ~uVar28 & local_398._52_4_;
      }
      else {
        local_398._52_4_ = uVar28 | local_398._52_4_;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    local_250._0_4_ = local_438.itype - (int)local_3b8;
    local_250._8_4_ = iStack_430;
    iVar30 = (int)(local_420 << 0x1e) >> 0x1f;
    local_250._4_4_ = iVar30 + auStack_42c[1] + 1;
    local_398._72_4_ = iVar30 + auStack_42c[1] + local_3b8._4_4_;
    local_398._68_4_ = local_438.itype - 1;
    local_398._56_4_ = local_438.itype - (int)local_3b8;
    local_398._60_4_ = local_250._4_4_;
    local_398._64_4_ = iStack_430 - local_3b0;
    local_398._76_4_ = iStack_430 + -1;
    local_398._80_4_ = (uint)local_410;
    lVar20 = 0;
    do {
      uVar28 = 1 << ((byte)lVar20 & 0x1f);
      uVar31 = (uint)lVar20;
      *(uint *)(local_398 + lVar20 * 4 + 0x44) =
           (*(int *)(local_398 + lVar20 * 4 + 0x44) + (uint)((uVar2 >> (uVar31 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_398._80_4_ >> (uVar31 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar31 & 0x1f) & 1) == 0) {
        local_398._80_4_ = ~uVar28 & local_398._80_4_;
      }
      else {
        local_398._80_4_ = uVar28 | local_398._80_4_;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    local_398._84_4_ = local_398._28_4_;
    local_398._88_4_ = auStack_42c[1] + iVar30 + 1;
    local_398._92_4_ = local_398._8_4_;
    local_398._100_4_ = auStack_42c[1] + iVar30 + local_3b8._4_4_;
    local_398._108_4_ = (uint)local_410;
    lVar20 = 0;
    do {
      uVar28 = 1 << ((byte)lVar20 & 0x1f);
      uVar31 = (uint)lVar20;
      *(uint *)(local_398 + lVar20 * 4 + 0x60) =
           (*(int *)(local_398 + lVar20 * 4 + 0x60) + (uint)((uVar2 >> (uVar31 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_398._108_4_ >> (uVar31 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar31 & 0x1f) & 1) == 0) {
        local_398._108_4_ = ~uVar28 & local_398._108_4_;
      }
      else {
        local_398._108_4_ = uVar28 | local_398._108_4_;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    local_250._0_4_ = local_438.itype - (int)local_3b8;
    iVar22 = (int)(local_420 << 0x1d) >> 0x1f;
    local_304 = iVar22 + IStack_424.itype + 1;
    local_2c8[2] = local_3b0 + iVar22 + IStack_424.itype;
    local_328 = (BCRec *)CONCAT44(uStack_434 - local_3b8._4_4_,local_250._0_4_);
    local_320 = (ProbParm *)CONCAT44(local_438.itype - 1,local_304);
    iStack_318 = uStack_434 - 1;
    uStack_314 = local_2c8[2];
    uStack_310 = (uint)local_410;
    lVar20 = 0;
    do {
      uVar31 = 1 << ((byte)lVar20 & 0x1f);
      uVar28 = (uint)lVar20;
      *(uint *)(local_398 + lVar20 * 4 + 0x7c) =
           (*(int *)(local_398 + lVar20 * 4 + 0x7c) + (uint)((uVar2 >> (uVar28 & 0x1f) & 1) != 0)) -
           (uint)((uStack_310 >> (uVar28 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar28 & 0x1f) & 1) == 0) {
        uStack_310 = ~uVar31 & uStack_310;
      }
      else {
        uStack_310 = uVar31 | uStack_310;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    uVar31 = local_420 & 1 ^ 1;
    iStack_30c = auStack_42c[0] + uVar31;
    iStack_308 = uStack_434 - local_3b8._4_4_;
    local_300 = (Real)CONCAT44(uStack_434 - 1,(int)local_3b8 + iStack_30c + -1);
    local_2f8 = local_2c8[2];
    local_2f4 = (uint)local_410;
    lVar20 = 0;
    do {
      uVar28 = 1 << ((byte)lVar20 & 0x1f);
      uVar24 = (uint)lVar20;
      *(uint *)(local_398 + lVar20 * 4 + 0x98) =
           (*(int *)(local_398 + lVar20 * 4 + 0x98) + (uint)((uVar2 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)((local_2f4 >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar24 & 0x1f) & 1) == 0) {
        local_2f4 = ~uVar28 & local_2f4;
      }
      else {
        local_2f4 = uVar28 | local_2f4;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    local_250._4_4_ = iVar30 + 1 + auStack_42c[1];
    local_2e4._4_4_ = iVar30 + auStack_42c[1] + local_3b8._4_4_;
    local_2e4._0_4_ = local_438.itype - 1;
    local_2f0 = (Real)CONCAT44(local_250._4_4_,local_250._0_4_);
    local_2e8 = IStack_424.itype + iVar22 + 1;
    local_2dc = iVar22 + IStack_424.itype + local_3b0;
    local_2d8 = (uint)local_410;
    lVar20 = 0;
    do {
      uVar28 = 1 << ((byte)lVar20 & 0x1f);
      uVar24 = (uint)lVar20;
      *(uint *)(local_398 + lVar20 * 4 + 0xb4) =
           (*(int *)(local_398 + lVar20 * 4 + 0xb4) + (uint)((uVar2 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)((local_2d8 >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar24 & 0x1f) & 1) == 0) {
        local_2d8 = ~uVar28 & local_2d8;
      }
      else {
        local_2d8 = uVar28 | local_2d8;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    local_2d4._0_4_ = uVar31 + auStack_42c[0];
    iVar19 = (int)local_3b8 + (int)local_2d4 + -1;
    local_2d4._4_4_ = auStack_42c[1] + iVar30 + 1;
    local_2cc = local_304;
    local_2c8[0] = iVar19;
    local_2c8[1] = iVar30 + auStack_42c[1] + local_3b8._4_4_;
    local_2c8[3] = (uint)local_410;
    lVar20 = 0;
    do {
      uVar31 = 1 << ((byte)lVar20 & 0x1f);
      uVar28 = (uint)lVar20;
      *(uint *)(local_398 + lVar20 * 4 + 0xd0) =
           (*(int *)(local_398 + lVar20 * 4 + 0xd0) + (uint)((uVar2 >> (uVar28 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_2c8[3] >> (uVar28 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar28 & 0x1f) & 1) == 0) {
        local_2c8[3] = ~uVar31 & local_2c8[3];
      }
      else {
        local_2c8[3] = uVar31 | local_2c8[3];
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    lVar20 = 0;
    do {
      iStack_15c = uStack_9c;
      uStack_164._4_4_ = uStack_a0;
      uStack_164._0_4_ = uStack_a4;
      local_168 = local_a8;
      local_140 = local_b8;
      uVar4 = local_d8._8_8_;
      uVar39 = *(ulong *)(local_398 + lVar20);
      uVar7 = *(ulong *)(local_398 + lVar20 + 0xc);
      local_408.smallend.vect[2] = (int)*(undefined8 *)(local_398 + lVar20 + 8);
      uVar38 = *(ulong *)(pBVar11->smallend).vect;
      uVar37 = CONCAT44(-(uint)((int)(uVar38 >> 0x20) < (int)(uVar39 >> 0x20)),
                        -(uint)((int)uVar38 < (int)uVar39));
      uVar38 = ~uVar37 & uVar38 | uVar39 & uVar37;
      local_408.smallend.vect[0] = (int)uVar38;
      local_408.smallend.vect[1] = (int)(uVar38 >> 0x20);
      iVar30 = (pBVar11->smallend).vect[2];
      if (iVar30 < local_408.smallend.vect[2]) {
        iVar30 = local_408.smallend.vect[2];
      }
      uVar38 = *(ulong *)(pBVar11->bigend).vect;
      uVar39 = CONCAT44(-(uint)((int)(uVar7 >> 0x20) < (int)(uVar38 >> 0x20)),
                        -(uint)((int)uVar7 < (int)uVar38));
      uVar38 = ~uVar39 & uVar38 | uVar7 & uVar39;
      local_408.bigend.vect[0] = (int)uVar38;
      local_408.bigend.vect[1] = (int)(uVar38 >> 0x20);
      local_408.bigend.vect[2] = (int)*(undefined8 *)(local_398 + lVar20 + 0x14);
      iVar22 = (pBVar11->bigend).vect[2];
      if (local_408.bigend.vect[2] < iVar22) {
        iVar22 = local_408.bigend.vect[2];
      }
      local_408.btype.itype = (uint)((ulong)*(undefined8 *)(local_398 + lVar20 + 0x14) >> 0x20);
      local_408.bigend.vect[2] = iVar22;
      local_250._8_4_ = SUB84(pdVar5,0);
      local_250._12_4_ = (undefined4)((ulong)pdVar5 >> 0x20);
      stack0xfffffffffffffdc0 = local_258;
      stack0xfffffffffffffdc8 = local_c0;
      local_230 = local_e0;
      local_228.x = local_d8._0_4_;
      local_228.y = local_d8._4_4_;
      local_228.z = (int)lVar25;
      local_21c = local_3a0;
      local_214 = (int)local_c8;
      iStack_210 = local_3d4;
      local_20c[2] = local_3c0;
      local_20c[1] = local_3bc;
      aiStack_1f0[0] = local_26c[1];
      aiStack_1f0[1] = local_26c[2];
      IStack_1e8.itype = IStack_260.itype;
      local_20c[3] = aiStack_278[0];
      iStack_1fc = aiStack_278[1];
      iStack_1f8 = iStack_270;
      uStack_1f4 = local_26c[0];
      local_1e0 = local_3a8;
      pPVar8 = (pGVar13->m_user_f).lprobparm;
      pAVar9 = (pGVar13->m_user_f).lacparm;
      aiStack_1d4[3] = (int)((ulong)*(undefined8 *)((long)&(pGVar13->m_user_f).lacparm + 4) >> 0x20)
      ;
      aiStack_1d4._16_8_ = *(undefined8 *)((long)&(pGVar13->m_user_f).lpmfdata + 4);
      local_1d8 = (int)pPVar8;
      aiStack_1d4[0] = (int)((ulong)pPVar8 >> 0x20);
      aiStack_1d4[1] = (int)pAVar9;
      aiStack_1d4[2] = (int)((ulong)pAVar9 >> 0x20);
      pRVar26 = &local_88;
      pRVar27 = &local_1b8;
      for (lVar21 = 10; lVar21 != 0; lVar21 = lVar21 + -1) {
        *pRVar27 = *pRVar26;
        pRVar26 = pRVar26 + (ulong)bVar32 * -2 + 1;
        pRVar27 = pRVar27 + (ulong)bVar32 * -2 + 1;
      }
      local_158 = (uint)uVar4;
      uStack_154 = SUB84(uVar4,4);
      local_150 = local_3c4;
      local_14c = local_3c8;
      local_148[1] = local_3d0;
      local_148[0] = local_3cc;
      local_138 = orig_comp;
      local_408.smallend.vect[2] = iVar30;
      For<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::ccfcdoit<amrex::FilfcFace>(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::FilfcFace&&)::_lambda(int,int,int)_3_>
                (&local_408,(anon_class_288_10_b99250ba *)local_250);
      lVar20 = lVar20 + 0x1c;
    } while (lVar20 != 0xe0);
  }
  return;
}

Assistant:

void
GpuBndryFuncFab<F>::ccfcdoit (Box const& bx, FArrayBox& dest,
                              const int dcomp, const int numcomp,
                              Geometry const& geom, const Real time,
                              const Vector<BCRec>& bcr, const int bcomp,
                              const int orig_comp, FF&& fillfunc)
{
    const IntVect& len = bx.length();

    IndexType idxType = bx.ixType();
    Box const& domain = amrex::convert(geom.Domain(),idxType);
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (geom.isPeriodic(idim)) {
            gdomain.grow(idim,len[idim]);
        }
    }

    if (gdomain.contains(bx)) return;

    Array4<Real> const& fab = dest.array();
    const auto geomdata = geom.data();

#ifdef AMREX_USE_GPU
    AsyncArray<BCRec> bcr_aa(bcr.data()+bcomp, numcomp);
    BCRec* bcr_p = bcr_aa.data();

    const auto f_user = m_user_f;

    // fill on the faces first
    {
        Array<Box,2*AMREX_SPACEDIM> dom_face_boxes
            = { AMREX_D_DECL(amrex::convert(amrex::adjCellLo(gdomain, 0, len[0]),idxType),
                             amrex::convert(amrex::adjCellLo(gdomain, 1, len[1]),idxType),
                             amrex::convert(amrex::adjCellLo(gdomain, 2, len[2]),idxType)),
                AMREX_D_DECL(amrex::convert(amrex::adjCellHi(gdomain, 0, len[0]),idxType),
                             amrex::convert(amrex::adjCellHi(gdomain, 1, len[1]),idxType),
                             amrex::convert(amrex::adjCellHi(gdomain, 2, len[2]),idxType)) };

        Vector<Box> face_boxes;
        for (const Box& b : dom_face_boxes) {
            Box tmp = b & bx;
            if (tmp.ok()) face_boxes.push_back(tmp);
        }
        const int n_face_boxes = face_boxes.size();
        if (n_face_boxes == 1) {
            amrex::ParallelFor(face_boxes[0],
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                AMREX_D_PICK(amrex::ignore_unused(j,k),amrex::ignore_unused(k),(void)0);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        } else if (n_face_boxes > 1) {
            AsyncArray<Box> face_boxes_aa(face_boxes.data(), n_face_boxes);
            Box* boxes_p = face_boxes_aa.data();
            Long ncounts = 0;
            for (const auto& b : face_boxes) {
                ncounts += b.numPts();
            }
            amrex::ParallelFor(ncounts,
            [=] AMREX_GPU_DEVICE (Long icount) noexcept
            {
                const auto& idx = getCell(boxes_p, n_face_boxes, icount);
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }

#if (AMREX_SPACEDIM >= 2)
    // fill on the box edges
    {
#if (AMREX_SPACEDIM == 2)
        Array<Box,4> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType) }};
#else
        Array<Box,12> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType) }};
#endif
        Vector<Box> edge_boxes;
        for (const Box& b : dom_edge_boxes) {
            Box tmp = b & bx;
            if (tmp.ok()) edge_boxes.push_back(tmp);
        }
        const int n_edge_boxes = edge_boxes.size();
        if (n_edge_boxes == 1) {
            amrex::ParallelFor(edge_boxes[0],
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                AMREX_D_PICK(amrex::ignore_unused(j,k),amrex::ignore_unused(k),(void)0);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        } else if (n_edge_boxes > 1) {
            AsyncArray<Box> edge_boxes_aa(edge_boxes.data(), n_edge_boxes);
            Box* boxes_p = edge_boxes_aa.data();
            Long ncounts = 0;
            for (const auto& b : edge_boxes) {
                ncounts += b.numPts();
            }
            amrex::ParallelFor(ncounts,
            [=] AMREX_GPU_DEVICE (Long icount) noexcept
            {
                const auto& idx = getCell(boxes_p, n_edge_boxes, icount);
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    // fill on corners
    {
        Array<Box,8> dom_corner_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType) }};

        Vector<Box> corner_boxes;
        for (const Box& b : dom_corner_boxes) {
            Box tmp = b & bx;
            if (tmp.ok()) corner_boxes.push_back(tmp);
        }
        const int n_corner_boxes = corner_boxes.size();
        if (n_corner_boxes == 1) {
            amrex::ParallelFor(corner_boxes[0],
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        } else if (n_corner_boxes > 1) {
            AsyncArray<Box> corner_boxes_aa(corner_boxes.data(), n_corner_boxes);
            Box* boxes_p = corner_boxes_aa.data();
            Long ncounts = 0;
            for (const auto& b : corner_boxes) {
                ncounts += b.numPts();
            }
            amrex::ParallelFor(ncounts,
            [=] AMREX_GPU_DEVICE (Long icount) noexcept
            {
                const auto& idx = getCell(boxes_p, n_corner_boxes, icount);
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#else
    BCRec const* bcr_p = bcr.data()+bcomp;

    const auto& f_user = m_user_f;

    // fill on the box faces first
    {
        Array<Box,2*AMREX_SPACEDIM> dom_face_boxes
            = {{ AMREX_D_DECL(amrex::convert(amrex::adjCellLo(gdomain, 0, len[0]),idxType),
                              amrex::convert(amrex::adjCellLo(gdomain, 1, len[1]),idxType),
                              amrex::convert(amrex::adjCellLo(gdomain, 2, len[2]),idxType)),
                 AMREX_D_DECL(amrex::convert(amrex::adjCellHi(gdomain, 0, len[0]),idxType),
                              amrex::convert(amrex::adjCellHi(gdomain, 1, len[1]),idxType),
                              amrex::convert(amrex::adjCellHi(gdomain, 2, len[2]),idxType)) }};

        for (const Box& b : dom_face_boxes) {
            Box tmp = b & bx;
            amrex::For(tmp, [=] (int i, int j, int k) noexcept
            {
                amrex::ignore_unused(j,k);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }

#if (AMREX_SPACEDIM >= 2)
    // fill on the box edges
    {
#if (AMREX_SPACEDIM == 2)
        Array<Box,4> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType) }};
#else
        Array<Box,12> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType) }};
#endif

        for (const Box& b : dom_edge_boxes) {
            Box tmp = b & bx;
            amrex::For(tmp, [=] (int i, int j, int k) noexcept
            {
                amrex::ignore_unused(j,k);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    // fill on box corners
    {
        Array<Box,8> dom_corner_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType) }};

        for (const Box& b : dom_corner_boxes) {
            Box tmp = b & bx;
            amrex::For(tmp, [=] (int i, int j, int k) noexcept
            {
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#endif
}